

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cpp
# Opt level: O0

void __thiscall Solver::Solver(Solver *this,Board *board)

{
  Board *board_local;
  Solver *this_local;
  
  this->numberOfNodes = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
  ::map(&this->pastSteps);
  std::vector<Board,_std::allocator<Board>_>::vector(&this->steps);
  Board::Board(&this->board);
  Board::operator=(&this->board,board);
  return;
}

Assistant:

Solver::Solver(Board board) {
    this->board = board;
}